

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleJitProfilingHelpers.cpp
# Opt level: O0

void Js::SimpleJitHelpers::RecordLoopImplicitCallFlags
               (void *framePtr,uint loopNum,int restoreCallFlags)

{
  ImplicitCallFlags flags_00;
  JavascriptCallStackLayout *pJVar1;
  FunctionBody *this;
  DynamicProfileInfo *this_00;
  ScriptContext *this_01;
  ThreadContext *this_02;
  ImplicitCallFlags *pIVar2;
  ImplicitCallFlags fls;
  ImplicitCallFlags *flags;
  ThreadContext *threadContext;
  DynamicProfileInfo *dynamicProfileInfo;
  FunctionBody *functionBody;
  JavascriptCallStackLayout *layout;
  int restoreCallFlags_local;
  uint loopNum_local;
  void *framePtr_local;
  
  pJVar1 = JavascriptCallStackLayout::FromFramePointer(framePtr);
  this = JavascriptFunction::GetFunctionBody(*(JavascriptFunction **)pJVar1);
  this_00 = FunctionBody::GetDynamicProfileInfo(this);
  this_01 = FunctionProxy::GetScriptContext((FunctionProxy *)this);
  this_02 = ScriptContext::GetThreadContext(this_01);
  pIVar2 = ThreadContext::GetAddressOfImplicitCallFlags(this_02);
  flags_00 = *pIVar2;
  DynamicProfileInfo::RecordLoopImplicitCallFlags(this_00,this,loopNum,flags_00);
  *pIVar2 = (ImplicitCallFlags)restoreCallFlags | flags_00;
  return;
}

Assistant:

void SimpleJitHelpers::RecordLoopImplicitCallFlags(void* framePtr, uint loopNum, int restoreCallFlags)
    {
        JIT_HELPER_NOT_REENTRANT_NOLOCK_HEADER(SimpleRecordLoopImplicitCallFlags);
        auto layout = JavascriptCallStackLayout::FromFramePointer(framePtr);
        FunctionBody* functionBody = layout->functionObject->GetFunctionBody();
        DynamicProfileInfo * dynamicProfileInfo = functionBody->GetDynamicProfileInfo();
        ThreadContext * threadContext = functionBody->GetScriptContext()->GetThreadContext();
        auto flags = threadContext->GetAddressOfImplicitCallFlags();

        const auto fls = *flags;
        dynamicProfileInfo->RecordLoopImplicitCallFlags(functionBody, loopNum, fls);

        // Due to how JITed code is lowered, even we requested the Opnd to be the size of ImplicitCallArgs, the full
        //     register is pushed, with whatever junk is in the upper bits. So mask them off.
        restoreCallFlags = restoreCallFlags & ((1 << sizeof(ImplicitCallFlags)*8) - 1);

        // If the caller doesn't want to add in any call flags they will pass zero in restoreCallFlags.
        //    and since ORing with 0 is idempotent, we can just OR it either way
        *flags = (ImplicitCallFlags)(restoreCallFlags | fls);
        JIT_HELPER_END(SimpleRecordLoopImplicitCallFlags);
    }